

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_named_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  byte *pbVar6;
  byte bVar7;
  
  if (bits == 0) {
    iVar2 = mbedtls_asn1_write_bitstring(p,start,buf,0);
    return iVar2;
  }
  pbVar6 = buf + ((bits + 7 >> 3) - 1);
  bVar7 = *pbVar6 >> (((byte)(bits + 7) & 0xf8) - (char)bits & 0x1f);
  while( true ) {
    uVar4 = bits - 1;
    if ((bVar7 & 1) != 0) {
      iVar2 = mbedtls_asn1_write_bitstring(p,start,buf,bits);
      return iVar2;
    }
    if (uVar4 == 0) break;
    bVar7 = bVar7 >> 1;
    bits = uVar4;
    if ((uVar4 & 7) == 0) {
      bVar7 = pbVar6[-1];
      pbVar6 = pbVar6 + -1;
    }
  }
  puVar1 = *p;
  iVar2 = -0x6c;
  iVar5 = iVar2;
  if ((start <= puVar1) && (puVar1 != start)) {
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    iVar3 = mbedtls_asn1_write_len(p,start,1);
    iVar5 = iVar3;
    if ((-1 < iVar3) &&
       (puVar1 = *p, iVar5 = iVar2, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
      *p = puVar1 + -1;
      puVar1[-1] = '\x03';
      iVar5 = iVar3 + 2;
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_asn1_write_named_bitstring( unsigned char **p,
                                        unsigned char *start,
                                        const unsigned char *buf,
                                        size_t bits )
{
    size_t unused_bits, byte_len;
    const unsigned char *cur_byte;
    unsigned char cur_byte_shifted;
    unsigned char bit;

    byte_len = ( bits + 7 ) / 8;
    unused_bits = ( byte_len * 8 ) - bits;

    /*
     * Named bitstrings require that trailing 0s are excluded in the encoding
     * of the bitstring. Trailing 0s are considered part of the 'unused' bits
     * when encoding this value in the first content octet
     */
    if( bits != 0 )
    {
        cur_byte = buf + byte_len - 1;
        cur_byte_shifted = *cur_byte >> unused_bits;

        for( ; ; )
        {
            bit = cur_byte_shifted & 0x1;
            cur_byte_shifted >>= 1;

            if( bit != 0 )
                break;

            bits--;
            if( bits == 0 )
                break;

            if( bits % 8 == 0 )
                cur_byte_shifted = *--cur_byte;
        }
    }

    return( mbedtls_asn1_write_bitstring( p, start, buf, bits ) );
}